

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O2

string * __thiscall
YAML::Exp::Escape_abi_cxx11_(string *__return_storage_ptr__,Exp *this,Stream *in)

{
  char cVar1;
  byte __rhs;
  ParserException *this_00;
  uint uVar2;
  int codeLength;
  char *pcVar3;
  Stream *pSStack_210;
  allocator local_1f9;
  Mark local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  stringstream msg;
  
  cVar1 = YAML::Stream::get((Stream *)this);
  __rhs = YAML::Stream::get((Stream *)this);
  if (__rhs == 0x27 && cVar1 == '\'') {
LAB_006a0aaf:
    pcVar3 = "\'";
    goto LAB_006a0ab6;
  }
  uVar2 = __rhs - 0x5c;
  if (0x1c < uVar2) {
    uVar2 = __rhs - 0x4c;
    if (uVar2 < 10) {
      codeLength = (&switchD_006a0b56::switchdataD_006eb1b4)[uVar2] + 0x6eb1b4;
      switch((uint)__rhs) {
      case 0x4c:
        pcVar3 = anon_var_dwarf_108046a;
        break;
      default:
        goto switchD_006a0aee_caseD_5d;
      case 0x4e:
        pcVar3 = anon_var_dwarf_1080456;
        break;
      case 0x50:
        pcVar3 = anon_var_dwarf_1080480;
        break;
      case 0x55:
        pSStack_210 = (Stream *)0x8;
        goto LAB_006a0be6;
      }
      goto LAB_006a0ab6;
    }
    if (__rhs != 9) {
      if (__rhs == 0x20) {
        pcVar3 = " ";
        goto LAB_006a0ab6;
      }
      if (__rhs == 0x22) {
        pcVar3 = "\"";
        goto LAB_006a0ab6;
      }
      if (__rhs != 0x27) {
        if (__rhs != 0x2f) {
          if (__rhs == 0x30) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
            return __return_storage_ptr__;
          }
          goto switchD_006a0aee_caseD_5d;
        }
        pcVar3 = "/";
        goto LAB_006a0ab6;
      }
      goto LAB_006a0aaf;
    }
switchD_006a0aee_caseD_74:
    pcVar3 = "\t";
    goto LAB_006a0ab6;
  }
  codeLength = (&switchD_006a0aee::switchdataD_006eb1dc)[uVar2] + 0x6eb1dc;
  switch((uint)__rhs) {
  case 0x5c:
    pcVar3 = "\\";
    break;
  default:
switchD_006a0aee_caseD_5d:
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    this_00 = (ParserException *)__cxa_allocate_exception(0x40);
    local_1f8._0_8_ = *(undefined8 *)(this + 8);
    local_1f8.column = *(int *)(this + 0x10);
    std::__cxx11::string::string((string *)&local_1e8,"unknown escape character: ",&local_1f9);
    std::operator+(&local_1c8,&local_1e8,__rhs);
    ParserException::ParserException(this_00,&local_1f8,&local_1c8);
    __cxa_throw(this_00,&ParserException::typeinfo,BadConversion::~BadConversion);
  case 0x5f:
    pcVar3 = anon_var_dwarf_1080460;
    break;
  case 0x61:
    pcVar3 = "\a";
    break;
  case 0x62:
    pcVar3 = "\b";
    break;
  case 0x65:
    pcVar3 = "\x1b";
    break;
  case 0x66:
    pcVar3 = "\f";
    break;
  case 0x6e:
    pcVar3 = "\n";
    break;
  case 0x72:
    pcVar3 = "\r";
    break;
  case 0x74:
    goto switchD_006a0aee_caseD_74;
  case 0x75:
    pSStack_210 = (Stream *)0x4;
    goto LAB_006a0be6;
  case 0x76:
    pcVar3 = "\v";
    break;
  case 0x78:
    pSStack_210 = (Stream *)0x2;
LAB_006a0be6:
    Escape_abi_cxx11_(__return_storage_ptr__,this,pSStack_210,codeLength);
    return __return_storage_ptr__;
  }
LAB_006a0ab6:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&msg);
  return __return_storage_ptr__;
}

Assistant:

std::string Escape(Stream& in) {
  // eat slash
  char escape = in.get();

  // switch on escape character
  char ch = in.get();

  // first do single quote, since it's easier
  if (escape == '\'' && ch == '\'')
    return "\'";

  // now do the slash (we're not gonna check if it's a slash - you better pass
  // one!)
  switch (ch) {
    case '0':
      return std::string(1, '\x00');
    case 'a':
      return "\x07";
    case 'b':
      return "\x08";
    case 't':
    case '\t':
      return "\x09";
    case 'n':
      return "\x0A";
    case 'v':
      return "\x0B";
    case 'f':
      return "\x0C";
    case 'r':
      return "\x0D";
    case 'e':
      return "\x1B";
    case ' ':
      return R"( )";
    case '\"':
      return "\"";
    case '\'':
      return "\'";
    case '\\':
      return "\\";
    case '/':
      return "/";
    case 'N':
      return "\x85";
    case '_':
      return "\xA0";
    case 'L':
      return "\xE2\x80\xA8";  // LS (#x2028)
    case 'P':
      return "\xE2\x80\xA9";  // PS (#x2029)
    case 'x':
      return Escape(in, 2);
    case 'u':
      return Escape(in, 4);
    case 'U':
      return Escape(in, 8);
  }

  std::stringstream msg;
  throw ParserException(in.mark(), std::string(ErrorMsg::INVALID_ESCAPE) + ch);
}